

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_wav_seek_to_pcm_frame(ma_dr_wav *pWav,ma_uint64 targetFrameIndex)

{
  ushort uVar1;
  ma_bool32 mVar2;
  ma_uint64 mVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ma_int16 devnull [2048];
  ma_int16 amStack_1038 [2052];
  
  if (pWav == (ma_dr_wav *)0x0) {
    return 0;
  }
  if (pWav->onSeek == (ma_dr_wav_seek_proc)0x0) {
    return 0;
  }
  if (pWav->onWrite != (ma_dr_wav_write_proc)0x0) {
    return 0;
  }
  uVar4 = pWav->totalPCMFrameCount;
  if (uVar4 == 0) {
    return 1;
  }
  if (uVar4 < targetFrameIndex) {
    targetFrameIndex = uVar4;
  }
  uVar1 = pWav->translatedFormatTag;
  if ((uVar1 == 0x11) || (uVar1 == 2)) {
    uVar4 = pWav->readCursorInPCMFrames;
    if (targetFrameIndex < uVar4) {
      mVar2 = ma_dr_wav_seek_to_first_pcm_frame(pWav);
      if (mVar2 == 0) {
        return 0;
      }
      uVar4 = pWav->readCursorInPCMFrames;
    }
    uVar6 = targetFrameIndex - uVar4;
    if (targetFrameIndex < uVar4 || uVar6 == 0) {
      return 1;
    }
    do {
      if (uVar6 == 0) {
        return 1;
      }
      uVar4 = (ulong)(0x800 / pWav->channels);
      if (uVar6 < uVar4) {
        uVar4 = uVar6;
      }
      if (pWav->translatedFormatTag == 0x11) {
        mVar3 = ma_dr_wav_read_pcm_frames_s16__ima(pWav,uVar4,amStack_1038);
      }
      else if (pWav->translatedFormatTag == 2) {
        mVar3 = ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav,uVar4,amStack_1038);
      }
      else {
        mVar3 = 0;
      }
      uVar6 = uVar6 - mVar3;
    } while (mVar3 == uVar4);
  }
  else {
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar5 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
    }
    else {
      uVar5 = (uint)(pWav->fmt).blockAlign;
    }
    if ((uVar1 & 0xfffe) == 6) {
      if (uVar5 == 0) {
        return 0;
      }
      if (uVar5 != (pWav->fmt).channels) {
        return 0;
      }
    }
    else if (uVar5 == 0) {
      return 0;
    }
    uVar6 = uVar4 * uVar5 - pWav->bytesRemaining;
    uVar7 = targetFrameIndex * uVar5;
    uVar4 = uVar7 - uVar6;
    if ((uVar7 < uVar6 || uVar4 == 0) &&
       (mVar2 = ma_dr_wav_seek_to_first_pcm_frame(pWav), uVar4 = uVar7, mVar2 == 0)) {
      return 0;
    }
    while( true ) {
      if (uVar4 == 0) {
        return 1;
      }
      uVar6 = 0x7fffffff;
      if (uVar4 < 0x7fffffff) {
        uVar6 = uVar4;
      }
      mVar2 = (*pWav->onSeek)(pWav->pUserData,(int)uVar6,ma_dr_wav_seek_origin_current);
      if (mVar2 == 0) break;
      pWav->readCursorInPCMFrames =
           pWav->readCursorInPCMFrames + (uVar6 & 0xffffffff) / (ulong)uVar5;
      pWav->bytesRemaining = pWav->bytesRemaining - uVar6;
      uVar4 = uVar4 - uVar6;
    }
  }
  return 0;
}

Assistant:

MA_API ma_bool32 ma_dr_wav_seek_to_pcm_frame(ma_dr_wav* pWav, ma_uint64 targetFrameIndex)
{
    if (pWav == NULL || pWav->onSeek == NULL) {
        return MA_FALSE;
    }
    if (pWav->onWrite != NULL) {
        return MA_FALSE;
    }
    if (pWav->totalPCMFrameCount == 0) {
        return MA_TRUE;
    }
    if (targetFrameIndex > pWav->totalPCMFrameCount) {
        targetFrameIndex = pWav->totalPCMFrameCount;
    }
    if (ma_dr_wav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        if (targetFrameIndex < pWav->readCursorInPCMFrames) {
            if (!ma_dr_wav_seek_to_first_pcm_frame(pWav)) {
                return MA_FALSE;
            }
        }
        if (targetFrameIndex > pWav->readCursorInPCMFrames) {
            ma_uint64 offsetInFrames = targetFrameIndex - pWav->readCursorInPCMFrames;
            ma_int16 devnull[2048];
            while (offsetInFrames > 0) {
                ma_uint64 framesRead = 0;
                ma_uint64 framesToRead = offsetInFrames;
                if (framesToRead > ma_dr_wav_countof(devnull)/pWav->channels) {
                    framesToRead = ma_dr_wav_countof(devnull)/pWav->channels;
                }
                if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM) {
                    framesRead = ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, devnull);
                } else if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
                    framesRead = ma_dr_wav_read_pcm_frames_s16__ima(pWav, framesToRead, devnull);
                } else {
                    MA_DR_WAV_ASSERT(MA_FALSE);
                }
                if (framesRead != framesToRead) {
                    return MA_FALSE;
                }
                offsetInFrames -= framesRead;
            }
        }
    } else {
        ma_uint64 totalSizeInBytes;
        ma_uint64 currentBytePos;
        ma_uint64 targetBytePos;
        ma_uint64 offset;
        ma_uint32 bytesPerFrame;
        bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
        if (bytesPerFrame == 0) {
            return MA_FALSE;
        }
        totalSizeInBytes = pWav->totalPCMFrameCount * bytesPerFrame;
        currentBytePos = totalSizeInBytes - pWav->bytesRemaining;
        targetBytePos  = targetFrameIndex * bytesPerFrame;
        if (currentBytePos < targetBytePos) {
            offset = (targetBytePos - currentBytePos);
        } else {
            if (!ma_dr_wav_seek_to_first_pcm_frame(pWav)) {
                return MA_FALSE;
            }
            offset = targetBytePos;
        }
        while (offset > 0) {
            int offset32 = ((offset > INT_MAX) ? INT_MAX : (int)offset);
            if (!pWav->onSeek(pWav->pUserData, offset32, ma_dr_wav_seek_origin_current)) {
                return MA_FALSE;
            }
            pWav->readCursorInPCMFrames += offset32 / bytesPerFrame;
            pWav->bytesRemaining        -= offset32;
            offset                      -= offset32;
        }
    }
    return MA_TRUE;
}